

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O0

void __thiscall Enterprise::Nick::output_attributed<4>(Nick *this,uint16_t *target,int columns)

{
  uint16_t local_26 [2];
  byte local_22;
  byte local_21;
  undefined1 auStack_20 [2];
  uint16_t palette [2];
  uint8_t attributes;
  uint8_t pixels;
  int c;
  int columns_local;
  uint16_t *target_local;
  Nick *this_local;
  
  stack0xffffffffffffffe4 = columns;
  _c = target;
  for (_auStack_20 = 0; _auStack_20 < columns; _auStack_20 = _auStack_20 + 1) {
    local_21 = this->ram_[(int)((uint)this->line_data_pointer_[1] + _auStack_20 & 0xffff)];
    local_22 = this->ram_[(int)((uint)this->line_data_pointer_[0] + _auStack_20 & 0xffff)];
    this->last_read_ = local_21;
    local_26[0] = this->palette_[(int)(uint)local_22 >> 4];
    local_26[1] = this->palette_[(int)(local_22 & 0xf)];
    *_c = local_26[(int)(local_21 & 0x80) >> 7];
    _c[1] = local_26[(int)(local_21 & 0x40) >> 6];
    _c[2] = local_26[(int)(local_21 & 0x20) >> 5];
    _c[3] = local_26[(int)(local_21 & 0x10) >> 4];
    _c[4] = local_26[(int)(local_21 & 8) >> 3];
    _c[5] = local_26[(int)(local_21 & 4) >> 2];
    _c[6] = local_26[(int)(local_21 & 2) >> 1];
    _c[7] = local_26[(int)(local_21 & 1)];
    _c = _c + 8;
  }
  return;
}

Assistant:

void Nick::output_attributed(uint16_t *target, int columns) const {
	static_assert(bpp == 1 || bpp == 2 || bpp == 4 || bpp == 8);

	for(int c = 0; c < columns; c++) {
		const uint8_t pixels = ram_[(line_data_pointer_[1] + c) & 0xffff];
		const uint8_t attributes = ram_[(line_data_pointer_[0] + c) & 0xffff];
		last_read_ = pixels;

		const uint16_t palette[2] = {
			palette_[attributes >> 4], palette_[attributes & 0x0f]
		};
		output1bpp(pixels);
	}
}